

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void monstone(monst *mdef)

{
  char cVar1;
  char cVar2;
  obj *poVar3;
  bool bVar4;
  boolean bVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  monst *local_38;
  boolean wasinside;
  xchar y;
  obj *poStack_28;
  xchar x;
  obj *oldminvent;
  obj *obj;
  obj *otmp;
  monst *mdef_local;
  
  cVar1 = mdef->mx;
  cVar2 = mdef->my;
  bVar4 = false;
  lifesaved_monster(mdef,0x12);
  if (mdef->mhp < 1) {
    *(uint *)&mdef->field_0x60 = *(uint *)&mdef->field_0x60 & 0xff7fffff;
    if ((mdef->data->msize == '\0') && (iVar6 = rn2((2 < (mdef->data->geno & 7)) + 2), iVar6 != 0))
    {
      obj = mksobj_at(0x213,level,(int)cVar1,(int)cVar2,'\x01','\0');
    }
    else {
      poStack_28 = (obj *)0x0;
      while (poVar3 = mdef->minvent, poVar3 != (obj *)0x0) {
        obj_extract_self(poVar3);
        if (poVar3->owornmask != 0) {
          update_mon_intrinsics(level,mdef,poVar3,'\0','\x01');
        }
        obj_no_longer_held(poVar3);
        if ((poVar3->owornmask & 0x100U) != 0) {
          setmnotwielded(mdef,poVar3);
        }
        poVar3->owornmask = 0;
        if ((poVar3->otyp == 0x214) || (bVar5 = obj_resists(poVar3,0,0), bVar5 != '\0')) {
          bVar5 = flooreffects(poVar3,(int)cVar1,(int)cVar2,"fall");
          if (bVar5 == '\0') {
            place_object(poVar3,level,(int)cVar1,(int)cVar2);
          }
        }
        else {
          if ((*(uint *)&poVar3->field_0x4a >> 0x13 & 1) != 0) {
            end_burn(poVar3,'\x01');
          }
          poVar3->nobj = poStack_28;
          poStack_28 = poVar3;
        }
      }
      local_38 = mdef;
      if (((((((*(uint *)&mdef->field_0x60 >> 0x19 & 1) == 0) && (mdef->mtame == '\0')) &&
            ((mdef->data->geno & 0x1000) == 0)) &&
           ((mdef->data != mons + 0x144 && (mdef->data != mons + 0x146)))) &&
          ((mdef->data != mons + 0x145 &&
           (((mdef->data->mlet != '4' || (mdef->data == mons + 0xfd)) || (mdef->data == mons + 0xfe)
            ))))) &&
         ((((mdef->data->mlet != '.' && (mdef->m_id != quest_status.leader_m_id)) &&
           (bVar5 = dmgtype(mdef->data,0x16), bVar5 == '\0')) &&
          (bVar5 = dmgtype(mdef->data,0x23), bVar5 == '\0')))) {
        local_38 = (monst *)0x0;
      }
      obj = mkcorpstat(0x215,local_38,mdef->data,level,(int)cVar1,(int)cVar2,'\0');
      if (mdef->mnamelth != '\0') {
        obj = oname(obj,(char *)((long)(mdef->mtrack + 0x18) + (long)(int)mdef->mxlth));
      }
      while (poStack_28 != (obj *)0x0) {
        poVar3 = poStack_28->nobj;
        add_to_container(obj,poStack_28);
        poStack_28 = poVar3;
      }
      if ((mdef->data->geno & 0x1000) != 0) {
        obj->spe = '\x01';
      }
      uVar7 = weight(obj);
      obj->owt = uVar7;
    }
    stackobj(obj);
    if ((*(uint *)&level->locations[cVar1][cVar2].field_0x6 >> 3 & 1) != 0) {
      unmap_object((int)cVar1,(int)cVar2);
    }
    if ((viz_array[cVar2][cVar1] & 2U) != 0) {
      newsym((int)cVar1,(int)cVar2);
    }
    if (((u._1052_1_ & 1) != 0) && (u.ustuck == mdef)) {
      bVar4 = true;
    }
    mondead(mdef);
    if ((bVar4) && ((mdef->data->mflags1 & 0x40000) != 0)) {
      pcVar8 = locomotion(youmonst.data,"jump");
      pcVar9 = xname(obj);
      pline("You %s through an opening in the new %s.",pcVar8,pcVar9);
    }
  }
  return;
}

Assistant:

void monstone(struct monst *mdef)
{
	struct obj *otmp, *obj, *oldminvent;
	xchar x = mdef->mx, y = mdef->my;
	boolean wasinside = FALSE;

	/* we have to make the statue before calling mondead, to be able to
	 * put inventory in it, and we have to check for lifesaving before
	 * making the statue....
	 */
	lifesaved_monster(mdef, AD_STON);
	if (mdef->mhp > 0) return;

	mdef->mtrapped = 0;	/* (see m_detach) */

	if ((int)mdef->data->msize > MZ_TINY ||
		    !rn2(2 + ((int) (mdef->data->geno & G_FREQ) > 2))) {
		oldminvent = 0;
		/* some objects may end up outside the statue */
		while ((obj = mdef->minvent) != 0) {
		    obj_extract_self(obj);
		    if (obj->owornmask)
			update_mon_intrinsics(level, mdef, obj, FALSE, TRUE);
		    obj_no_longer_held(obj);
		    if (obj->owornmask & W_WEP)
			setmnotwielded(mdef,obj);
		    obj->owornmask = 0L;
		    if (obj->otyp == BOULDER ||
				obj_resists(obj, 0, 0)) {
			if (flooreffects(obj, x, y, "fall")) continue;
			place_object(obj, level, x, y);
		    } else {
			if (obj->lamplit) end_burn(obj, TRUE);
			obj->nobj = oldminvent;
			oldminvent = obj;
		    }
		}
		
		/* defer statue creation until after inventory removal
		   so that saved monster traits won't retain any stale
		   item-conferred attributes */
		otmp = mkcorpstat(STATUE, KEEPTRAITS(mdef) ? mdef : 0,
				  mdef->data, level, x, y, FALSE);
		if (mdef->mnamelth) otmp = oname(otmp, NAME(mdef));
		while ((obj = oldminvent) != 0) {
		    oldminvent = obj->nobj;
		    add_to_container(otmp, obj);
		}
		/* Archeologists should not break unique statues */
		if (mdef->data->geno & G_UNIQ)
			otmp->spe = 1;
		otmp->owt = weight(otmp);
	} else
		otmp = mksobj_at(ROCK, level, x, y, TRUE, FALSE);

	stackobj(otmp);
	/* mondead() already does this, but we must do it before the newsym */
	if (level->locations[x][y].mem_invis)
	    unmap_object(x, y);
	if (cansee(x, y))
	    newsym(x,y);
	/* We don't currently trap the hero in the statue in this case but we could */
	if (u.uswallow && u.ustuck == mdef) wasinside = TRUE;
	mondead(mdef);
	if (wasinside) {
		if (is_animal(mdef->data))
			pline("You %s through an opening in the new %s.",
				locomotion(youmonst.data, "jump"),
				xname(otmp));
	}
}